

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

ComponentPtr
libcellml::flattenComponent(ComponentEntityPtr *parent,ComponentPtr *component,size_t index)

{
  size_t *psVar1;
  pointer *this;
  undefined8 uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  __type _Var5;
  element_type *peVar6;
  string *psVar7;
  element_type *peVar8;
  element_type *peVar9;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var10;
  __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  element_type *peVar13;
  element_type *peVar14;
  size_t sVar15;
  reference oldName;
  pointer ppVar16;
  element_type *peVar17;
  int iVar18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RCX;
  pointer *ppuVar19;
  void *__child_stack;
  ModelPtr *model_00;
  void *__child_stack_00;
  ComponentPtr *component_00;
  void *__child_stack_01;
  size_t value;
  ComponentPtr *in_R8;
  ComponentPtr *in_R9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar20;
  ComponentPtr CVar21;
  __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_798;
  UnitsPtr targetUnits;
  iterator local_698;
  iterator match;
  string finalUnitsName;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *alias;
  iterator __end2_4;
  iterator __begin2_4;
  StringStringMap *__range2_4;
  StringStringMap changedNames;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *entry_1;
  iterator __end4;
  iterator __begin4;
  StringStringMap *__range4;
  string ref;
  size_t unitIndex;
  shared_ptr<libcellml::Units> replacementUnits;
  undefined1 local_5b8 [16];
  string local_5a8;
  string local_588;
  string local_568;
  undefined1 local_548 [8];
  UnitsPtr foundUnits;
  UnitsPtr flattenedUnits;
  size_t unitsIndex;
  shared_ptr<libcellml::Units> *units_2;
  iterator __end2_3;
  iterator __begin2_3;
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  *__range2_3;
  StringStringMap unitNamesToReplace;
  undefined1 local_4c0 [8];
  ModelPtr flatModel;
  undefined1 local_490 [8];
  VariablePtr importedComponentVariable;
  VariablePtr localModelVariable;
  size_t j;
  VariablePtr placeholderVariable;
  size_t i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3e8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3e0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3d8;
  undefined1 local_3d0 [8];
  string newName;
  size_t count;
  string originalName;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>
  *entry;
  iterator __end2_2;
  iterator __begin2_2;
  ComponentNameMap *__range2_2;
  ComponentNameMap newComponentNames;
  shared_ptr<libcellml::Units> *units_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  *__range2_1;
  ModelPtr requiredUnitsModel;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  __normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
  local_268;
  shared_ptr<libcellml::Units> local_260;
  __normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
  local_250;
  __normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
  local_248;
  __normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
  local_240;
  __normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
  iterator;
  shared_ptr<libcellml::Units> *units;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  *__range2;
  StringStringMap aliasedUnitsNames;
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  uniqueRequiredUnits;
  undefined1 local_1c0 [8];
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  requiredUnits;
  _Base_ptr local_198;
  size_t i;
  undefined1 local_170 [8];
  ComponentPtr importedComponentCopy;
  EquivalenceMap rebasedMap;
  EquivalenceMap map;
  IndexStack importedComponentBaseIndexStack;
  IndexStack destinationComponentBaseIndexStack;
  NameList compNames;
  ModelPtr clonedImportModel;
  undefined1 local_88 [8];
  ComponentPtr importedComponent;
  ModelPtr importModel;
  ImportSourcePtr importSource;
  shared_ptr<const_libcellml::ParentedEntity> local_48;
  undefined1 local_38 [8];
  ModelPtr model;
  size_t index_local;
  ComponentPtr *component_local;
  ComponentEntityPtr *parent_local;
  
  model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RCX;
  peVar6 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)index);
  bVar4 = ImportedEntity::isImport(&peVar6->super_ImportedEntity);
  if (bVar4) {
    std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Component,void>
              ((shared_ptr<libcellml::ParentedEntity_const> *)&local_48,
               (shared_ptr<libcellml::Component> *)index);
    owningModel((libcellml *)local_38,(ParentedEntityConstPtr *)&local_48);
    std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_48);
    std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)index);
    ImportedEntity::importSource
              ((ImportedEntity *)
               &importModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)&importModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount);
    ImportSource::model((ImportSource *)
                        &importedComponent.
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
    psVar7 = (string *)
             std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&importedComponent.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
    peVar6 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)index);
    ImportedEntity::importReference_abi_cxx11_
              ((string *)
               &clonedImportModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&peVar6->super_ImportedEntity);
    iVar18 = 1;
    ComponentEntity::component
              ((ComponentEntity *)local_88,psVar7,(bool)((char)&clonedImportModel + '\b'));
    std::__cxx11::string::~string
              ((string *)
               &clonedImportModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    peVar8 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&importedComponent.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
    Model::clone((Model *)&compNames.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(__fn *)peVar8,
                 __child_stack,iVar18,in_R8);
    componentNames_abi_cxx11_
              ((NameList *)
               &destinationComponentBaseIndexStack.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(libcellml *)local_38,model_00);
    indexStackOf((IndexStack *)
                 &importedComponentBaseIndexStack.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(ComponentPtr *)index);
    indexStackOf((IndexStack *)&map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (ComponentPtr *)local_88);
    psVar1 = &rebasedMap._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::
    map<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
    ::map((map<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
           *)psVar1);
    recordVariableEquivalences
              ((ComponentPtr *)local_88,(EquivalenceMap *)psVar1,
               (IndexStack *)&map._M_t._M_impl.super__Rb_tree_header._M_node_count);
    generateEquivalenceMap
              ((ComponentPtr *)local_88,
               (EquivalenceMap *)&rebasedMap._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (IndexStack *)&map._M_t._M_impl.super__Rb_tree_header._M_node_count);
    ppuVar19 = &importedComponentBaseIndexStack.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    rebaseEquivalenceMap
              ((EquivalenceMap *)
               &importedComponentCopy.
                super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (EquivalenceMap *)&rebasedMap._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (IndexStack *)&map._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (IndexStack *)ppuVar19);
    iVar18 = (int)ppuVar19;
    peVar6 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_88);
    Component::clone((Component *)local_170,(__fn *)peVar6,__child_stack_00,iVar18,in_R8);
    peVar6 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_170);
    peVar9 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)index);
    NamedEntity::name_abi_cxx11_((string *)&i,(NamedEntity *)peVar9);
    NamedEntity::setName((NamedEntity *)peVar6,(string *)&i);
    std::__cxx11::string::~string((string *)&i);
    local_198 = (_Base_ptr)0x0;
    while( true ) {
      peVar6 = std::
               __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)index);
      _Var10._M_node = (_Base_ptr)ComponentEntity::componentCount(&peVar6->super_ComponentEntity);
      if (_Var10._M_node <= local_198) break;
      peVar6 = std::
               __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_170);
      peVar9 = std::
               __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)index);
      ComponentEntity::component
                ((ComponentEntity *)
                 &requiredUnits.
                  super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_t)peVar9);
      ComponentEntity::addComponent
                (&peVar6->super_ComponentEntity,
                 (ComponentPtr *)
                 &requiredUnits.
                  super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::shared_ptr<libcellml::Component>::~shared_ptr
                ((shared_ptr<libcellml::Component> *)
                 &requiredUnits.
                  super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_198 = (_Base_ptr)((long)&local_198->_M_color + 1);
    }
    this = &uniqueRequiredUnits.
            super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::shared_ptr<libcellml::Component_const>::shared_ptr<libcellml::Component,void>
              ((shared_ptr<libcellml::Component_const> *)this,
               (shared_ptr<libcellml::Component> *)local_170);
    unitsUsed((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
               *)local_1c0,
              (ModelPtr *)
              &compNames.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,(ComponentConstPtr *)this);
    std::shared_ptr<const_libcellml::Component>::~shared_ptr
              ((shared_ptr<const_libcellml::Component> *)
               &uniqueRequiredUnits.
                super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>::
    vector((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
            *)&aliasedUnitsNames._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&__range2);
    __end2 = std::
             vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
             ::begin((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                      *)local_1c0);
    units = (shared_ptr<libcellml::Units> *)
            std::
            vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
            ::end((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                   *)local_1c0);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
                                       *)&units), bVar4) {
      iterator._M_current =
           __gnu_cxx::
           __normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
           ::operator*(&__end2);
      psVar1 = &aliasedUnitsNames._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_248._M_current =
           (shared_ptr<libcellml::Units> *)
           std::
           vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
           ::begin((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                    *)psVar1);
      local_250._M_current =
           (shared_ptr<libcellml::Units> *)
           std::
           vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
           ::end((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                  *)psVar1);
      std::shared_ptr<libcellml::Units>::shared_ptr(&local_260,iterator._M_current);
      local_240 = std::
                  find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<libcellml::Units>*,std::vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>>,libcellml::flattenComponent(std::shared_ptr<libcellml::ComponentEntity>const&,std::shared_ptr<libcellml::Component>&,unsigned_long)::__0>
                            (local_248,local_250,(anon_class_16_1_a8be468f_for__M_pred *)&local_260)
      ;
      flattenComponent(std::shared_ptr<libcellml::ComponentEntity>const&,std::shared_ptr<libcellml::Component>&,unsigned_long)
      ::$_0::~__0((__0 *)&local_260);
      local_268._M_current =
           (shared_ptr<libcellml::Units> *)
           std::
           vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
           ::end((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                  *)&aliasedUnitsNames._M_t._M_impl.super__Rb_tree_header._M_node_count);
      bVar4 = __gnu_cxx::operator==(&local_240,&local_268);
      if (bVar4) {
        std::
        vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
        ::push_back((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                     *)&aliasedUnitsNames._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    iterator._M_current);
      }
      else {
        p_Var11 = (__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                  )__gnu_cxx::
                   __normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
                   ::operator*(&local_240);
        peVar14 = std::
                  __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(p_Var11);
        NamedEntity::name_abi_cxx11_(&local_288,&peVar14->super_NamedEntity);
        peVar14 = std::
                  __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)iterator._M_current);
        NamedEntity::name_abi_cxx11_(&local_2a8,&peVar14->super_NamedEntity);
        bVar4 = std::operator!=(&local_288,&local_2a8);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::string::~string((string *)&local_288);
        if (bVar4) {
          peVar14 = std::
                    __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)iterator._M_current);
          NamedEntity::name_abi_cxx11_(&local_2c8,&peVar14->super_NamedEntity);
          p_Var11 = (__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)__gnu_cxx::
                       __normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
                       ::operator*(&local_240);
          peVar14 = std::
                    __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(p_Var11);
          NamedEntity::name_abi_cxx11_(&local_2e8,&peVar14->super_NamedEntity);
          pVar20 = std::
                   map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                   ::emplace<std::__cxx11::string,std::__cxx11::string>
                             ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                               *)&__range2,&local_2c8,&local_2e8);
          _Var10 = pVar20.first._M_node;
          requiredUnitsModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var10._M_node;
          std::__cxx11::string::~string((string *)&local_2e8);
          std::__cxx11::string::~string((string *)&local_2c8);
        }
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
      ::operator++(&__end2);
    }
    Model::create();
    psVar1 = &aliasedUnitsNames._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __end2_1 = std::
               vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
               ::begin((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                        *)psVar1);
    units_1 = (shared_ptr<libcellml::Units> *)
              std::
              vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
              ::end((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                     *)psVar1);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
                               *)&units_1), bVar4) {
      p_Var11 = (__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                __gnu_cxx::
                __normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
                ::operator*(&__end2_1);
      peVar8 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&__range2_1);
      peVar14 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(p_Var11);
      Units::clone((Units *)&newComponentNames._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (__fn *)peVar14,__child_stack_01,(int)_Var10._M_node,in_R8);
      Model::addUnits(peVar8,(UnitsPtr *)
                             &newComponentNames._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::shared_ptr<libcellml::Units>::~shared_ptr
                ((shared_ptr<libcellml::Units> *)
                 &newComponentNames._M_t._M_impl.super__Rb_tree_header._M_node_count);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
      ::operator++(&__end2_1);
    }
    createComponentNamesMap_abi_cxx11_
              ((ComponentNameMap *)&__range2_2,(libcellml *)local_170,component_00);
    __end2_2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>_>_>
               ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>_>_>
                        *)&__range2_2);
    entry = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>_>_>
               ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>_>_>
                      *)&__range2_2);
    while (bVar4 = std::operator!=(&__end2_2,(_Self *)&entry), bVar4) {
      originalName.field_2._8_8_ =
           std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>_>
           ::operator*(&__end2_2);
      std::__cxx11::string::string((string *)&count,(string *)originalName.field_2._8_8_);
      newName.field_2._8_8_ = 0;
      std::__cxx11::string::string((string *)local_3d0,(string *)&count);
      while( true ) {
        ppuVar19 = &destinationComponentBaseIndexStack.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        local_3e0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)ppuVar19);
        local_3e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)ppuVar19);
        local_3d8 = std::
                    find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                              (local_3e0,
                               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                )local_3e8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_3d0);
        local_3f0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&destinationComponentBaseIndexStack.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
        bVar4 = __gnu_cxx::operator!=(&local_3d8,&local_3f0);
        if (!bVar4) break;
        std::operator+(&local_430,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&count,
                       "_");
        newName.field_2._8_8_ = newName.field_2._8_8_ + 1;
        convertToString_abi_cxx11_((string *)&i_1,(libcellml *)newName.field_2._8_8_,value);
        std::operator+(&local_410,&local_430,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1);
        std::__cxx11::string::operator=((string *)local_3d0,(string *)&local_410);
        std::__cxx11::string::~string((string *)&local_410);
        std::__cxx11::string::~string((string *)&i_1);
        std::__cxx11::string::~string((string *)&local_430);
      }
      bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &count,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_3d0);
      if (bVar4) {
        peVar6 = std::
                 __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)(originalName.field_2._8_8_ + 0x20));
        NamedEntity::setName((NamedEntity *)peVar6,(string *)local_3d0);
      }
      std::__cxx11::string::~string((string *)local_3d0);
      std::__cxx11::string::~string((string *)&count);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>_>
      ::operator++(&__end2_2);
    }
    placeholderVariable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    while( true ) {
      _Var3._M_pi = placeholderVariable.
                    super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
      peVar6 = std::
               __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)index);
      p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Component::variableCount(peVar6);
      if (p_Var12 <= _Var3._M_pi) break;
      peVar6 = std::
               __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)index);
      Component::variable((Component *)&j,(size_t)peVar6);
      localModelVariable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      while( true ) {
        peVar13 = std::
                  __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&j);
        p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  Variable::equivalentVariableCount(peVar13);
        if (p_Var12 <=
            localModelVariable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi) break;
        peVar13 = std::
                  __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&j);
        Variable::equivalentVariable
                  ((Variable *)
                   &importedComponentVariable.
                    super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   (size_t)peVar13);
        peVar6 = std::
                 __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_170);
        peVar13 = std::
                  __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&j);
        NamedEntity::name_abi_cxx11_
                  ((string *)
                   &flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,&peVar13->super_NamedEntity);
        Component::variable((Component *)local_490,(string *)peVar6);
        std::__cxx11::string::~string
                  ((string *)
                   &flatModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        Variable::addEquivalence
                  ((VariablePtr *)local_490,
                   (VariablePtr *)
                   &importedComponentVariable.
                    super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        std::shared_ptr<libcellml::Variable>::~shared_ptr
                  ((shared_ptr<libcellml::Variable> *)local_490);
        std::shared_ptr<libcellml::Variable>::~shared_ptr
                  ((shared_ptr<libcellml::Variable> *)
                   &importedComponentVariable.
                    super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        localModelVariable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(localModelVariable.
                      super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_vptr__Sp_counted_base + 1);
      }
      std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)&j);
      placeholderVariable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(placeholderVariable.
                    super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi)->_vptr__Sp_counted_base + 1);
    }
    peVar17 = std::
              __shared_ptr_access<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)component);
    ComponentEntity::replaceComponent
              (peVar17,(size_t)model.
                               super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi,(ComponentPtr *)local_170);
    psVar1 = &unitNamesToReplace._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Component,void>
              ((shared_ptr<libcellml::ParentedEntity_const> *)psVar1,
               (shared_ptr<libcellml::Component> *)local_170);
    owningModel((libcellml *)local_4c0,(ParentedEntityConstPtr *)psVar1);
    std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr
              ((shared_ptr<const_libcellml::ParentedEntity> *)
               &unitNamesToReplace._M_t._M_impl.super__Rb_tree_header._M_node_count);
    applyEquivalenceMapToModel
              ((EquivalenceMap *)
               &importedComponentCopy.
                super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (ModelPtr *)local_4c0);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&__range2_3);
    psVar1 = &aliasedUnitsNames._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __end2_3 = std::
               vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
               ::begin((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                        *)psVar1);
    units_2 = (shared_ptr<libcellml::Units> *)
              std::
              vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
              ::end((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                     *)psVar1);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2_3,
                              (__normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
                               *)&units_2), bVar4) {
      local_798 = (__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                  )__gnu_cxx::
                   __normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
                   ::operator*(&__end2_3);
      flattenedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::shared_ptr<libcellml::Units>::shared_ptr
                ((shared_ptr<libcellml::Units> *)
                 &foundUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(nullptr_t)0x0);
      peVar14 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(local_798);
      bVar4 = ImportedEntity::isImport(&peVar14->super_ImportedEntity);
      if (bVar4) {
        psVar7 = (string *)
                 std::
                 __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&compNames.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        peVar14 = std::
                  __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(local_798);
        NamedEntity::name_abi_cxx11_(&local_568,&peVar14->super_NamedEntity);
        Model::units((Model *)local_548,psVar7);
        std::__cxx11::string::~string((string *)&local_568);
        while (bVar4 = std::operator==((shared_ptr<libcellml::Units> *)
                                       &foundUnits.
                                        super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount,(nullptr_t)0x0), bVar4) {
          peVar14 = std::
                    __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_548);
          NamedEntity::name_abi_cxx11_(&local_588,&peVar14->super_NamedEntity);
          peVar8 = std::
                   __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&compNames.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          Model::units((Model *)local_5b8,(size_t)peVar8);
          peVar14 = std::
                    __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_5b8);
          NamedEntity::name_abi_cxx11_((string *)(local_5b8 + 0x10),&peVar14->super_NamedEntity);
          _Var5 = std::operator==(&local_588,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(local_5b8 + 0x10));
          std::__cxx11::string::~string((string *)(local_5b8 + 0x10));
          std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_5b8);
          std::__cxx11::string::~string((string *)&local_588);
          if (_Var5) {
            flattenUnitsImports((libcellml *)
                                &compNames.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (ModelPtr *)local_798,
                                (UnitsPtr *)
                                flattenedUnits.
                                super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi,(size_t)local_170,in_R8);
            peVar8 = std::
                     __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&compNames.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
            Model::units((Model *)&replacementUnits.
                                   super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount,(size_t)peVar8);
            std::shared_ptr<libcellml::Units>::operator=
                      ((shared_ptr<libcellml::Units> *)
                       &foundUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,
                       (shared_ptr<libcellml::Units> *)
                       &replacementUnits.
                        super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      );
            std::shared_ptr<libcellml::Units>::~shared_ptr
                      ((shared_ptr<libcellml::Units> *)
                       &replacementUnits.
                        super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      );
          }
          flattenedUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(flattenedUnits.
                        super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi)->_vptr__Sp_counted_base + 1);
        }
        std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_548);
      }
      bVar4 = std::operator!=((shared_ptr<libcellml::Units> *)
                              &foundUnits.
                               super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount,(nullptr_t)0x0);
      if (bVar4) {
        local_798 = (__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)&foundUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount;
      }
      std::shared_ptr<libcellml::Units>::shared_ptr
                ((shared_ptr<libcellml::Units> *)&unitIndex,
                 (shared_ptr<libcellml::Units> *)local_798);
      ref.field_2._8_8_ = 0;
      while( true ) {
        uVar2 = ref.field_2._8_8_;
        peVar14 = std::
                  __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&unitIndex);
        sVar15 = Units::unitCount(peVar14);
        if (sVar15 <= (ulong)uVar2) break;
        peVar14 = std::
                  __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&unitIndex);
        Units::unitAttributeReference_abi_cxx11_((string *)&__range4,peVar14,ref.field_2._8_8_);
        __end4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&__range2_3);
        entry_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&__range2_3);
        while (bVar4 = std::operator!=(&__end4,(_Self *)&entry_1), bVar4) {
          changedNames._M_t._M_impl.super__Rb_tree_header._M_node_count =
               (size_t)std::
                       _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator*(&__end4);
          _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&__range4,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)changedNames._M_t._M_impl.super__Rb_tree_header._M_node_count);
          if (_Var5) {
            peVar14 = std::
                      __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&unitIndex);
            Units::setUnitAttributeReference
                      (peVar14,ref.field_2._8_8_,
                       (string *)
                       (changedNames._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x20));
          }
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator++(&__end4);
        }
        std::__cxx11::string::~string((string *)&__range4);
        ref.field_2._8_8_ = ref.field_2._8_8_ + 1;
      }
      in_R8 = (ComponentPtr *)local_170;
      transferUnitsRenamingIfRequired_abi_cxx11_
                ((StringStringMap *)&__range2_4,
                 (libcellml *)
                 &compNames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(ModelPtr *)local_4c0,
                 (ModelPtr *)&unitIndex,(UnitsPtr *)in_R8,in_R9);
      bVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&__range2_4);
      if (!bVar4) {
        std::
        map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::merge<std::less<std::__cxx11::string>>
                  ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&__range2_3,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&__range2_4);
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&__range2_4);
      std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)&unitIndex);
      std::shared_ptr<libcellml::Units>::~shared_ptr
                ((shared_ptr<libcellml::Units> *)
                 &foundUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
      ::operator++(&__end2_3);
    }
    __end2_4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&__range2);
    alias = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&__range2);
    while (bVar4 = std::operator!=(&__end2_4,(_Self *)&alias), bVar4) {
      oldName = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator*(&__end2_4);
      std::__cxx11::string::string((string *)&match,(string *)&oldName->second);
      local_698 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&__range2_3,(key_type *)&match);
      targetUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&__range2_3);
      bVar4 = std::operator!=(&stack0xfffffffffffff968,
                              (_Self *)&targetUnits.
                                        super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
      if (bVar4) {
        ppVar16 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator->(&stack0xfffffffffffff968);
        std::__cxx11::string::operator=((string *)&match,(string *)&ppVar16->second);
      }
      psVar7 = (string *)
               std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_4c0);
      Model::units((Model *)&stack0xfffffffffffff950,psVar7);
      updateUnitsNameUsages
                (&oldName->first,(string *)&match,(ComponentPtr *)local_170,
                 (UnitsPtr *)&stack0xfffffffffffff950);
      std::shared_ptr<libcellml::Units>::~shared_ptr
                ((shared_ptr<libcellml::Units> *)&stack0xfffffffffffff950);
      std::__cxx11::string::~string((string *)&match);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end2_4);
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&__range2_3);
    std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_4c0);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>_>_>
            *)&__range2_2);
    std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)&__range2_1);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&__range2);
    std::
    vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>::
    ~vector((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
             *)&aliasedUnitsNames._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>::
    ~vector((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
             *)local_1c0);
    std::shared_ptr<libcellml::Component>::~shared_ptr
              ((shared_ptr<libcellml::Component> *)local_170);
    std::
    map<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
    ::~map((map<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
            *)&importedComponentCopy.
               super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::
    map<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
    ::~map((map<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>
            *)&rebasedMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &map._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &importedComponentBaseIndexStack.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&destinationComponentBaseIndexStack.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    std::shared_ptr<libcellml::Model>::~shared_ptr
              ((shared_ptr<libcellml::Model> *)
               &compNames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_88)
    ;
    std::shared_ptr<libcellml::Model>::~shared_ptr
              ((shared_ptr<libcellml::Model> *)
               &importedComponent.
                super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<libcellml::ImportSource>::~shared_ptr
              ((shared_ptr<libcellml::ImportSource> *)
               &importModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_38);
  }
  peVar17 = std::
            __shared_ptr_access<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)component);
  CVar21 = ComponentEntity::component((ComponentEntity *)parent,(size_t)peVar17);
  CVar21.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)parent;
  return (ComponentPtr)CVar21.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ComponentPtr flattenComponent(const ComponentEntityPtr &parent, ComponentPtr &component, size_t index)
{
    if (component->isImport()) {
        auto model = owningModel(component);
        auto importSource = component->importSource();
        auto importModel = importSource->model();
        auto importedComponent = importModel->component(component->importReference());
        // Clone import model to not affect origin import model units.
        auto clonedImportModel = importModel->clone();

        NameList compNames = componentNames(model);

        // Determine the stack for the destination component.
        IndexStack destinationComponentBaseIndexStack = indexStackOf(component);

        // Determine the stack for the source component.
        IndexStack importedComponentBaseIndexStack = indexStackOf(importedComponent);

        // Generate equivalence map for the source component.
        EquivalenceMap map;
        recordVariableEquivalences(importedComponent, map, importedComponentBaseIndexStack);
        generateEquivalenceMap(importedComponent, map, importedComponentBaseIndexStack);

        // Rebase the generated equivalence map from the source component to the destination component.
        auto rebasedMap = rebaseEquivalenceMap(map, importedComponentBaseIndexStack, destinationComponentBaseIndexStack);

        // Take a copy of the imported component which will be used to replace the import defined in this model.
        auto importedComponentCopy = importedComponent->clone();
        importedComponentCopy->setName(component->name());
        for (size_t i = 0; i < component->componentCount(); ++i) {
            importedComponentCopy->addComponent(component->component(i));
        }

        // Get list of required units from component's variables and math cn elements.
        std::vector<UnitsPtr> requiredUnits = unitsUsed(clonedImportModel, importedComponentCopy);

        std::vector<UnitsPtr> uniqueRequiredUnits;
        StringStringMap aliasedUnitsNames;
        for (const auto &units : requiredUnits) {
            const auto iterator = std::find_if(uniqueRequiredUnits.begin(), uniqueRequiredUnits.end(),
                                               [=](const UnitsPtr &u) -> bool { return Units::equivalent(u, units); });
            if (iterator == uniqueRequiredUnits.end()) {
                uniqueRequiredUnits.push_back(units);
            } else if ((*iterator)->name() != units->name()) {
                aliasedUnitsNames.emplace(units->name(), (*iterator)->name());
            }
        }

        // Add all required units to a model so referenced units can be resolved.
        auto requiredUnitsModel = Model::create();
        for (const auto &units : uniqueRequiredUnits) {
            // Cloning units present elsewhere so that they don't get moved by the addUnits function.
            requiredUnitsModel->addUnits(units->clone());
        }

        // Make a map of component name to component pointer.
        ComponentNameMap newComponentNames = createComponentNamesMap(importedComponentCopy);
        for (const auto &entry : newComponentNames) {
            std::string originalName = entry.first;
            size_t count = 0;
            std::string newName = originalName;
            while (std::find(compNames.begin(), compNames.end(), newName) != compNames.end()) {
                newName = originalName + "_" + convertToString(++count);
            }
            if (originalName != newName) {
                entry.second->setName(newName);
            }
        }

        // If the component 'component' has variables then they are equivalent variables and they
        // need to be exchanged with the real variables from the component 'importedComponent'.
        for (size_t i = 0; i < component->variableCount(); ++i) {
            auto placeholderVariable = component->variable(i);
            for (size_t j = 0; j < placeholderVariable->equivalentVariableCount(); ++j) {
                auto localModelVariable = placeholderVariable->equivalentVariable(j);
                auto importedComponentVariable = importedComponentCopy->variable(placeholderVariable->name());
                Variable::addEquivalence(importedComponentVariable, localModelVariable);
            }
        }
        parent->replaceComponent(index, importedComponentCopy);
        auto flatModel = owningModel(importedComponentCopy);

        // Apply the re-based equivalence map onto the modified model.
        applyEquivalenceMapToModel(rebasedMap, flatModel);

        StringStringMap unitNamesToReplace;
        for (const auto &units : uniqueRequiredUnits) {
            // If the required units are imported units, we will resolve those units here.
            size_t unitsIndex = 0;
            UnitsPtr flattenedUnits = nullptr;
            if (units->isImport()) {
                auto foundUnits = clonedImportModel->units(units->name());
                while (flattenedUnits == nullptr) {
                    if (foundUnits->name() == clonedImportModel->units(unitsIndex)->name()) {
                        flattenUnitsImports(clonedImportModel, units, unitsIndex, importedComponentCopy);
                        flattenedUnits = clonedImportModel->units(unitsIndex);
                    }
                    unitsIndex += 1;
                }
            }

            auto replacementUnits = (flattenedUnits != nullptr) ? flattenedUnits : units;

            for (size_t unitIndex = 0; unitIndex < replacementUnits->unitCount(); ++unitIndex) {
                const std::string ref = replacementUnits->unitAttributeReference(unitIndex);
                for (const auto &entry : unitNamesToReplace) {
                    if (ref == entry.first) {
                        replacementUnits->setUnitAttributeReference(unitIndex, entry.second);
                    }
                }
            }
            StringStringMap changedNames = transferUnitsRenamingIfRequired(clonedImportModel, flatModel, replacementUnits, importedComponentCopy);
            if (!changedNames.empty()) {
                unitNamesToReplace.merge(changedNames);
            }
        }

        for (const auto &alias : aliasedUnitsNames) {
            std::string finalUnitsName = alias.second;
            const auto match = unitNamesToReplace.find(finalUnitsName);
            if (match != unitNamesToReplace.end()) {
                finalUnitsName = match->second;
            }
            UnitsPtr targetUnits = flatModel->units(finalUnitsName);
            updateUnitsNameUsages(alias.first, finalUnitsName, importedComponentCopy, targetUnits);
        }
    }

    return parent->component(index);
}